

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_bench.c
# Opt level: O2

bool_t ecpBench(void)

{
  long lVar1;
  err_t eVar2;
  u32 seed;
  size_t sVar3;
  tm_ticks_t tVar4;
  tm_ticks_t tVar5;
  bool_t bVar6;
  long lVar7;
  word *d;
  void *state_00;
  bool bVar8;
  bign_params params [1];
  octet state [6000];
  
  sVar3 = bignStart_keep(0x80,_ecpBench_deep);
  bVar6 = 0;
  if (sVar3 < 0x1771) {
    eVar2 = bignParamsStd(params,"1.2.112.0.2.0.34.101.45.3.1");
    if (eVar2 == 0) {
      eVar2 = bignStart((ec_o *)state,params);
      bVar6 = 0;
      if (eVar2 == 0) {
        state[0xa0] = '\0';
        state[0xa1] = '\0';
        state[0xa2] = '\0';
        state[0xa3] = '\0';
        state[0xa4] = '\0';
        state[0xa5] = '\0';
        state[0xa6] = '\0';
        state[0xa7] = '\0';
        state_00 = (void *)((long)&(((ec_o *)state)->hdr).keep + state._0_8_);
        sVar3 = prngCOMBO_keep();
        lVar1 = *(long *)(state._24_8_ + 0x30);
        d = (word *)(sVar3 + (long)state_00) + lVar1 * 2;
        seed = utilNonce32();
        prngCOMBOStart(state_00,seed);
        tVar4 = tmTicks();
        lVar7 = 1000;
        while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
          prngCOMBOStepR(d,*(size_t *)(state._24_8_ + 0x38),state_00);
          ecMulA((word *)(sVar3 + (long)state_00),(word *)state._48_8_,(ec_o *)state,d,
                 *(size_t *)(state._24_8_ + 0x30),d + lVar1);
        }
        tVar5 = tmTicks();
        sVar3 = tmSpeed(1000,tVar5 - tVar4);
        printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n",
               (tVar5 - tVar4) / 1000 & 0xffffffff,sVar3 & 0xffffffff);
        bVar6 = 1;
      }
    }
  }
  return bVar6;
}

Assistant:

bool_t ecpBench()
{
	// описание кривой
	bign_params params[1];
	// состояние
	octet state[6000];
	ec_o* ec;
	octet* combo_state;
	word* pt;
	word* d;
	void* stack;
	// подготовить память
	if (sizeof(state) < bignStart_keep(128, _ecpBench_deep))
		return FALSE;
	// загрузить параметры и создать описание кривой
	if (bignParamsStd(params, "1.2.112.0.2.0.34.101.45.3.1") != ERR_OK ||
		bignStart(state, params) != ERR_OK)
		return FALSE;
	// раскладка состояния
	ec = (ec_o*)state;
	ec->tpl = 0;
	combo_state = objEnd(ec, octet);
	pt = (word*)(combo_state + prngCOMBO_keep());
	d = pt + 2 * ec->f->n;
	stack = d + ec->f->n;
	// создать генератор COMBO
	prngCOMBOStart(combo_state, utilNonce32());
	// оценить число кратных точек в секунду
	{
		const size_t reps = 1000;
		size_t i;
		tm_ticks_t ticks;
		// эксперимент
		for (i = 0, ticks = tmTicks(); i < reps; ++i)
		{
			prngCOMBOStepR(d, ec->f->no, combo_state);
			ecMulA(pt, ec->base, ec, d, ec->f->n, stack);
		}
		ticks = tmTicks() - ticks;
		// печать результатов
		printf("ecpBench: %u cycles/mulpoint [%u mulpoints/sec]\n", 
			(unsigned)(ticks / reps),
			(unsigned)tmSpeed(reps, ticks));
	}
	// все нормально
	return TRUE;
}